

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O0

bool editions_unittest::TestDelimited::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  TestDelimited *extendee;
  uint32_t *puVar2;
  TestDelimited *this_;
  MessageLite *msg_local;
  
  extendee = default_instance();
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized
                    ((ExtensionSet *)(msg + 1),(MessageLite *)extendee);
  if (bVar1) {
    puVar2 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)&msg[2]._internal_metadata_,0);
    if (((*puVar2 & 2) == 0) ||
       (bVar1 = IsInitialized((TestDelimited *)msg[3]._internal_metadata_.ptr_), bVar1)) {
      msg_local._7_1_ = true;
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool TestDelimited::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const TestDelimited&>(msg);
  if (!this_._impl_._extensions_.IsInitialized(&default_instance())) {
    return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.nested_->IsInitialized()) return false;
  }
  return true;
}